

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

int Msat_ClauseSimplify(Msat_Clause_t *pC,int *pAssigns)

{
  int iVar1;
  float Num;
  uint local_2c;
  float Activ;
  int j;
  int i;
  Msat_Var_t Var;
  int *pAssigns_local;
  Msat_Clause_t *pC_local;
  
  local_2c = 0;
  Activ = 0.0;
  do {
    if ((int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff) <= (int)Activ) {
      if ((int)local_2c < (int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff)) {
        Num = Msat_ClauseReadActivity(pC);
        *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0xfffe0007 | (local_2c & 0x3fff) << 3;
        Msat_ClauseWriteActivity(pC,Num);
      }
      return 0;
    }
    iVar1 = (&pC[1].Num)[(int)Activ] >> 1;
    if (pAssigns[iVar1] == -1) {
      (&pC[1].Num)[(int)local_2c] = (&pC[1].Num)[(int)Activ];
      local_2c = local_2c + 1;
    }
    else {
      if (pAssigns[iVar1] == (&pC[1].Num)[(int)Activ]) {
        return 1;
      }
      if ((int)Activ < 2) {
        __assert_fail("i >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/msat/msatClause.c"
                      ,0x186,"int Msat_ClauseSimplify(Msat_Clause_t *, int *)");
      }
    }
    Activ = (float)((int)Activ + 1);
  } while( true );
}

Assistant:

int  Msat_ClauseSimplify( Msat_Clause_t * pC, int * pAssigns )
{
    Msat_Var_t Var;
    int i, j;
    for ( i = j = 0; i < (int)pC->nSize; i++ )
    {
        Var = MSAT_LIT2VAR(pC->pData[i]);
        if ( pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
            pC->pData[j++] = pC->pData[i];
            continue;
        }
        if ( pAssigns[Var] == pC->pData[i] )
            return 1;
        // otherwise, the value of the literal is false
        // make sure, this literal is not watched
        assert( i >= 2 );
    }
    // if the size has changed, update it and move activity
    if ( j < (int)pC->nSize )
    {
        float Activ = Msat_ClauseReadActivity(pC);
        pC->nSize = j;
        Msat_ClauseWriteActivity(pC, Activ);
    }
    return 0;
}